

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O3

void __thiscall
Js::JavascriptExceptionContext::StackFrame::StackFrame
          (StackFrame *this,JavascriptFunction *func,JavascriptStackWalker *walker,
          bool initArgumentTypes)

{
  anon_union_8_2_4da9e1e4_for_StackFrame_1 *addr;
  uint32 uVar1;
  FunctionBody *pFVar2;
  anon_union_8_2_4da9e1e4_for_StackFrame_1 aVar3;
  
  (this->functionBody).ptr = (FunctionBody *)0x0;
  (this->argumentTypes).types = 0x2000000000000000;
  pFVar2 = JavascriptFunction::GetFunctionBody(func);
  Memory::Recycler::WBSetBit((char *)this);
  (this->functionBody).ptr = pFVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  addr = &this->field_1;
  if ((this->functionBody).ptr == (FunctionBody *)0x0) {
    aVar3 = (anon_union_8_2_4da9e1e4_for_StackFrame_1)
            JavascriptStackWalker::GetCurrentNativeLibraryEntryName(walker);
    Memory::Recycler::WBSetBit((char *)&addr->byteCodeOffset);
    *addr = aVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  else {
    uVar1 = JavascriptStackWalker::GetByteCodeOffset(walker);
    addr->byteCodeOffset = uVar1;
  }
  if (initArgumentTypes && (this->functionBody).ptr != (FunctionBody *)0x0) {
    StackTraceArguments::Init(&this->argumentTypes,walker);
    return;
  }
  return;
}

Assistant:

JavascriptExceptionContext::StackFrame::StackFrame(JavascriptFunction* func, const JavascriptStackWalker& walker, bool initArgumentTypes)
    {
        this->functionBody = func->GetFunctionBody();

        if (this->functionBody)
        {
            this->byteCodeOffset = walker.GetByteCodeOffset();
        }
        else
        {
            this->name = walker.GetCurrentNativeLibraryEntryName();
        }

        if (this->functionBody && initArgumentTypes)
        {
            this->argumentTypes.Init(walker);
        }
    }